

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O2

bool __thiscall ObjDumpParser::parseFunctionDecl(ObjDumpParser *this,char **data,size_t size)

{
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = *data;
  bVar2 = expectAddress(data);
  if (bVar2) {
    bVar2 = expectString<3ul>(data,(char (*) [3])" <");
    if (bVar2) {
      bVar2 = eqString<3ul>(pcVar1 + (size - 2),(char (*) [3])">:");
      if (bVar2) {
        pcVar1[size - 2] = '\0';
        bVar2 = ScParser::parseFunctionDecl(this->m_scParser,data);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool ObjDumpParser::parseFunctionDecl(char *&data, std::size_t size)
{
    char *const endOfData = data + size - 2;

    if (!(expectAddress(data) && expectString(data, " <"))) {
        return false;
    }

    if (!eqString(endOfData, ">:")) {
        return false;
    }
    *endOfData = 0;

    return m_scParser.parseFunctionDecl(data);
}